

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int mem_compress_stdin_open(char *filename,int rwmode,int *hdl)

{
  memdriver *pmVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (rwmode == 0) {
    iVar3 = mem_createmem(0x7080,hdl);
    if (iVar3 == 0) {
      iVar3 = mem_uncompress2mem(filename,_stdin,*hdl);
      iVar2 = *hdl;
      pmVar1 = memTable + iVar2;
      if (iVar3 == 0) {
        if (*memTable[iVar2].memsizeptr <= memTable[iVar2].fitsfilesize + 0x100U) {
          return 0;
        }
        pcVar4 = (char *)realloc(*pmVar1->memaddrptr,memTable[iVar2].fitsfilesize);
        if (pcVar4 != (char *)0x0) {
          iVar3 = *hdl;
          *memTable[iVar3].memaddrptr = pcVar4;
          *memTable[iVar3].memsizeptr = memTable[iVar3].fitsfilesize;
          return 0;
        }
        ffpmsg("Failed to reduce size of allocated memory (compress_stdin_open)");
        return 0x71;
      }
      free(*pmVar1->memaddrptr);
      pmVar1->memaddrptr = (char **)0x0;
      memTable[iVar2].memaddr = (char *)0x0;
      pcVar4 = "failed to uncompress stdin into memory (compress_stdin_open)";
    }
    else {
      pcVar4 = "failed to create empty memory file (compress_stdin_open)";
    }
    ffpmsg(pcVar4);
  }
  else {
    ffpmsg("cannot open compressed input stream with WRITE access (mem_compress_stdin_open)");
    iVar3 = 0x70;
  }
  return iVar3;
}

Assistant:

int mem_compress_stdin_open(char *filename, int rwmode, int *hdl)
/*
  This routine reads the compressed input stream and creates an empty memory
  buffer, then calls mem_uncompress2mem.
*/
{
    int status;
    char *ptr;

    if (rwmode != READONLY)
    {
        ffpmsg(
  "cannot open compressed input stream with WRITE access (mem_compress_stdin_open)");
        return(READONLY_FILE);
    }
 
    /* create a memory file for the uncompressed file */
    status = mem_createmem(28800, hdl);

    if (status)
    {
        ffpmsg("failed to create empty memory file (compress_stdin_open)");
        return(status);
    }

    /* uncompress file into memory */
    status = mem_uncompress2mem(filename, stdin, *hdl);

    if (status)
    {
        mem_close_free(*hdl);   /* free up the memory */
        ffpmsg("failed to uncompress stdin into memory (compress_stdin_open)");
        return(status);
    }

    /* if we allocated too much memory initially, then free it */
    if (*(memTable[*hdl].memsizeptr) > 
       (( (size_t) memTable[*hdl].fitsfilesize) + 256L) ) 
    {
        ptr = realloc(*(memTable[*hdl].memaddrptr), 
                      ((size_t) memTable[*hdl].fitsfilesize) );
        if (!ptr)
        {
            ffpmsg("Failed to reduce size of allocated memory (compress_stdin_open)");
            return(MEMORY_ALLOCATION);
        }

        *(memTable[*hdl].memaddrptr) = ptr;
        *(memTable[*hdl].memsizeptr) = (size_t) (memTable[*hdl].fitsfilesize);
    }

    return(0);
}